

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O0

void __thiscall
copy_on_write<IntermediateBaseB>::copy_on_write<MultiplyDerived,void>
          (copy_on_write<IntermediateBaseB> *this,copy_on_write<MultiplyDerived> *p)

{
  IntermediateBaseB *local_78;
  shared_ptr<delegating_shared_control_block<IntermediateBaseB,_MultiplyDerived>_> local_60;
  shared_ptr<delegating_shared_control_block<IntermediateBaseB,_MultiplyDerived>_> local_50 [2];
  undefined1 local_30 [8];
  copy_on_write<MultiplyDerived> tmp;
  copy_on_write<MultiplyDerived> *p_local;
  copy_on_write<IntermediateBaseB> *this_local;
  
  this->ptr_ = (IntermediateBaseB *)0x0;
  tmp.cb_.super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p;
  std::shared_ptr<shared_control_block<IntermediateBaseB>_>::shared_ptr(&this->cb_);
  copy_on_write<MultiplyDerived>::copy_on_write
            ((copy_on_write<MultiplyDerived> *)local_30,
             (copy_on_write<MultiplyDerived> *)
             tmp.cb_.
             super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  local_78 = (IntermediateBaseB *)0x0;
  if (local_30 != (undefined1  [8])0x0) {
    local_78 = (IntermediateBaseB *)&((IntermediateBaseA *)local_30)->field_0x10;
  }
  this->ptr_ = local_78;
  std::
  make_shared<delegating_shared_control_block<IntermediateBaseB,MultiplyDerived>,std::shared_ptr<shared_control_block<MultiplyDerived>>>
            ((shared_ptr<shared_control_block<MultiplyDerived>_> *)&local_60);
  std::
  static_pointer_cast<shared_control_block<IntermediateBaseB>,delegating_shared_control_block<IntermediateBaseB,MultiplyDerived>>
            (local_50);
  std::shared_ptr<shared_control_block<IntermediateBaseB>_>::operator=
            (&this->cb_,(shared_ptr<shared_control_block<IntermediateBaseB>_> *)local_50);
  std::shared_ptr<shared_control_block<IntermediateBaseB>_>::~shared_ptr
            ((shared_ptr<shared_control_block<IntermediateBaseB>_> *)local_50);
  std::shared_ptr<delegating_shared_control_block<IntermediateBaseB,_MultiplyDerived>_>::~shared_ptr
            (&local_60);
  copy_on_write<MultiplyDerived>::~copy_on_write((copy_on_write<MultiplyDerived> *)local_30);
  return;
}

Assistant:

copy_on_write(const copy_on_write<U>& p)
  {
    copy_on_write<U> tmp(p);
    ptr_ = tmp.ptr_;
    cb_ = std::static_pointer_cast<shared_control_block<T>>(
        std::make_shared<delegating_shared_control_block<T, U>>(
            std::move(tmp.cb_)));
  }